

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  sqlite3 *db;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  ulong uVar5;
  char *z;
  code *xDel;
  char *zFormat;
  long lVar6;
  long lVar7;
  double dVar8;
  ulong uStack_100;
  DateTime x;
  DateTime y;
  char zBuf [100];
  
  if (argc == 0) {
    return;
  }
  puVar4 = sqlite3_value_text(*argv);
  if (puVar4 == (uchar *)0x0) {
    return;
  }
  iVar2 = isDate(context,argc + -1,argv + 1,&x);
  if (iVar2 != 0) {
    return;
  }
  db = context->pOut->db;
  uVar5 = 1;
  lVar6 = 0;
  do {
    if (puVar4[lVar6] == '%') {
      uVar1 = puVar4[lVar6 + 1];
      lVar6 = lVar6 + 1;
      switch(uVar1) {
      case 'd':
      case 'm':
switchD_001864f8_caseD_64:
        uVar5 = uVar5 + 1;
        break;
      case 'e':
      case 'g':
      case 'h':
      case 'i':
      case 'k':
      case 'l':
        goto switchD_001864f8_caseD_65;
      case 'f':
switchD_001864f8_caseD_66:
        uVar5 = uVar5 + 8;
        break;
      case 'j':
        uVar5 = uVar5 + 3;
        break;
      default:
        if (uVar1 != '%') {
          if (uVar1 != 'H') {
            if (uVar1 == 'J') {
LAB_00186505:
              uVar5 = uVar5 + 0x32;
              break;
            }
            if ((uVar1 != 'M') && (uVar1 != 'S')) {
              if (uVar1 == 'w') break;
              if (uVar1 == 'Y') goto switchD_001864f8_caseD_66;
              if (uVar1 == 's') goto LAB_00186505;
              if (uVar1 != 'W') {
                return;
              }
            }
          }
          goto switchD_001864f8_caseD_64;
        }
      }
    }
    else if (puVar4[lVar6] == '\0') break;
    lVar6 = lVar6 + 1;
    uVar5 = uVar5 + 1;
  } while( true );
  if (uVar5 < 100) {
    z = zBuf;
  }
  else {
    if ((ulong)(long)db->aLimit[0] < uVar5) {
      sqlite3_result_error_toobig(context);
      return;
    }
    z = (char *)sqlite3DbMallocRawNN(db,(long)(int)uVar5);
    if (z == (char *)0x0) {
      sqlite3_result_error_nomem(context);
      return;
    }
  }
  computeJD(&x);
  computeYMD_HMS(&x);
  lVar6 = 0;
  lVar7 = 0;
  do {
    uVar1 = puVar4[lVar7];
    if (uVar1 != '%') {
      if (uVar1 == '\0') {
        z[lVar6] = '\0';
        xDel = (_func_void_void_ptr *)0xffffffffffffffff;
        if (z != zBuf) {
          xDel = sqlite3MallocSize;
        }
        sqlite3_result_text(context,z,-1,xDel);
switchD_001864f8_caseD_65:
        return;
      }
      z[lVar6] = uVar1;
LAB_0018657c:
      lVar6 = lVar6 + 1;
      goto LAB_001867d0;
    }
    uVar1 = puVar4[lVar7 + 1];
    lVar7 = lVar7 + 1;
    switch(uVar1) {
    case 'd':
      uVar5 = (ulong)(uint)x.D;
      break;
    case 'e':
    case 'g':
    case 'h':
    case 'i':
    case 'k':
    case 'l':
switchD_00186614_caseD_65:
      z[lVar6] = '%';
      goto LAB_0018657c;
    case 'f':
      dVar8 = 59.999;
      if (x.s <= 59.999) {
        dVar8 = x.s;
      }
      iVar2 = 7;
      zFormat = "%06.3f";
LAB_001867bc:
      sqlite3_snprintf(iVar2,z + lVar6,zFormat,dVar8);
LAB_001867c3:
      uVar3 = sqlite3Strlen30(z + lVar6);
      uStack_100 = (ulong)uVar3;
      goto LAB_001867cd;
    case 'j':
switchD_00186614_caseD_6a:
      y.s = x.s;
      y.iJD = x.iJD;
      y._40_8_ = x._40_8_ & 0xffffffffffffff00;
      y.M = 1;
      y.Y = x.Y;
      y.h = x.h;
      y.D = 1;
      computeJD(&y);
      iVar2 = (int)(((x.iJD + 43200000) - y.iJD) / 86400000);
      if (uVar1 == 'W') {
        sqlite3_snprintf(3,z + lVar6,"%02d",
                         (long)((iVar2 - (int)(((x.iJD + 43200000) / 86400000) % 7)) + 7) / 7 &
                         0xffffffff);
        uStack_100 = 2;
      }
      else {
        sqlite3_snprintf(4,z + lVar6,"%03d",(ulong)(iVar2 + 1));
        uStack_100 = 3;
      }
LAB_001867cd:
      lVar6 = lVar6 + uStack_100;
      goto LAB_001867d0;
    case 'm':
      uVar5 = (ulong)(uint)x.M;
      break;
    default:
      if (uVar1 == 'H') {
        uVar5 = (ulong)(uint)x.h;
      }
      else {
        if (uVar1 == 'J') {
          dVar8 = (double)x.iJD / 86400000.0;
          iVar2 = 0x14;
          zFormat = "%.16g";
          goto LAB_001867bc;
        }
        if (uVar1 == 'M') {
          uVar5 = (ulong)(uint)x.m;
        }
        else {
          if (uVar1 != 'S') {
            if (uVar1 == 'W') goto switchD_00186614_caseD_6a;
            if (uVar1 == 'Y') {
              sqlite3_snprintf(5,z + lVar6,"%04d",(ulong)(uint)x.Y);
            }
            else {
              if (uVar1 != 's') {
                if (uVar1 == 'w') {
                  z[lVar6] = (char)(((x.iJD + 0x7b98a00) / 86400000) % 7) + '0';
                  goto LAB_0018657c;
                }
                goto switchD_00186614_caseD_65;
              }
              sqlite3_snprintf(0x1e,z + lVar6,"%lld",x.iJD / 1000 + -0x3118a36940);
            }
            goto LAB_001867c3;
          }
          uVar5 = (ulong)(uint)(int)x.s;
        }
      }
    }
    sqlite3_snprintf(3,z + lVar6,"%02d",uVar5);
    lVar6 = lVar6 + 2;
LAB_001867d0:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  u64 n;
  size_t i,j;
  char *z;
  sqlite3 *db;
  const char *zFmt;
  char zBuf[100];
  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  for(i=0, n=1; zFmt[i]; i++, n++){
    if( zFmt[i]=='%' ){
      switch( zFmt[i+1] ){
        case 'd':
        case 'H':
        case 'm':
        case 'M':
        case 'S':
        case 'W':
          n++;
          /* fall thru */
        case 'w':
        case '%':
          break;
        case 'f':
          n += 8;
          break;
        case 'j':
          n += 3;
          break;
        case 'Y':
          n += 8;
          break;
        case 's':
        case 'J':
          n += 50;
          break;
        default:
          return;  /* ERROR.  return a NULL */
      }
      i++;
    }
  }
  testcase( n==sizeof(zBuf)-1 );
  testcase( n==sizeof(zBuf) );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH] );
  if( n<sizeof(zBuf) ){
    z = zBuf;
  }else if( n>(u64)db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
    return;
  }else{
    z = sqlite3DbMallocRawNN(db, (int)n);
    if( z==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
  }
  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    if( zFmt[i]!='%' ){
      z[j++] = zFmt[i];
    }else{
      i++;
      switch( zFmt[i] ){
        case 'd':  sqlite3_snprintf(3, &z[j],"%02d",x.D); j+=2; break;
        case 'f': {
          double s = x.s;
          if( s>59.999 ) s = 59.999;
          sqlite3_snprintf(7, &z[j],"%06.3f", s);
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'H':  sqlite3_snprintf(3, &z[j],"%02d",x.h); j+=2; break;
        case 'W': /* Fall thru */
        case 'j': {
          int nDay;             /* Number of days since 1st day of year */
          DateTime y = x;
          y.validJD = 0;
          y.M = 1;
          y.D = 1;
          computeJD(&y);
          nDay = (int)((x.iJD-y.iJD+43200000)/86400000);
          if( zFmt[i]=='W' ){
            int wd;   /* 0=Monday, 1=Tuesday, ... 6=Sunday */
            wd = (int)(((x.iJD+43200000)/86400000)%7);
            sqlite3_snprintf(3, &z[j],"%02d",(nDay+7-wd)/7);
            j += 2;
          }else{
            sqlite3_snprintf(4, &z[j],"%03d",nDay+1);
            j += 3;
          }
          break;
        }
        case 'J': {
          sqlite3_snprintf(20, &z[j],"%.16g",x.iJD/86400000.0);
          j+=sqlite3Strlen30(&z[j]);
          break;
        }
        case 'm':  sqlite3_snprintf(3, &z[j],"%02d",x.M); j+=2; break;
        case 'M':  sqlite3_snprintf(3, &z[j],"%02d",x.m); j+=2; break;
        case 's': {
          sqlite3_snprintf(30,&z[j],"%lld",
                           (i64)(x.iJD/1000 - 21086676*(i64)10000));
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'S':  sqlite3_snprintf(3,&z[j],"%02d",(int)x.s); j+=2; break;
        case 'w': {
          z[j++] = (char)(((x.iJD+129600000)/86400000) % 7) + '0';
          break;
        }
        case 'Y': {
          sqlite3_snprintf(5,&z[j],"%04d",x.Y); j+=sqlite3Strlen30(&z[j]);
          break;
        }
        default:   z[j++] = '%'; break;
      }
    }
  }
  z[j] = 0;
  sqlite3_result_text(context, z, -1,
                      z==zBuf ? SQLITE_TRANSIENT : SQLITE_DYNAMIC);
}